

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> __thiscall
xemmai::t_parser::f_or(t_parser *this,bool a_assignable)

{
  t_script *ptVar1;
  undefined7 in_register_00000031;
  long lVar2;
  undefined1 local_50 [8];
  t_at at;
  
  lVar2 = CONCAT71(in_register_00000031,a_assignable);
  f_xor(this,a_assignable);
  while ((*(char *)(lVar2 + 0x68) == '\0' && (*(int *)(lVar2 + 0x88) == 0x18))) {
    at.v_column = *(size_t *)(lVar2 + 0x60);
    at.v_position = *(long *)(lVar2 + 0x50);
    at.v_line = *(size_t *)(lVar2 + 0x58);
    t_lexer::f_next((t_lexer *)(lVar2 + 8));
    ptVar1 = (t_script *)operator_new(0x38);
    f_xor((t_parser *)local_50,a_assignable);
    (ptVar1->v_path).field_2._M_allocated_capacity = at.v_column;
    (ptVar1->v_path)._M_dataplus._M_p = (pointer)at.v_position;
    (ptVar1->v_path)._M_string_length = at.v_line;
    (ptVar1->super_t_body)._vptr_t_body = (_func_int **)&PTR__t_binary_001ad240;
    (ptVar1->v_path).field_2._M_local_buf[2] = L'Ǽ';
    (ptVar1->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
    super__Deque_impl_data._M_map = (_Map_pointer)this->v_module;
    (ptVar1->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
    super__Deque_impl_data._M_map_size = (size_t)local_50;
    this->v_module = ptVar1;
  }
  return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
         )(__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<ast::t_node> t_parser::f_or(bool a_assignable)
{
	auto node = f_xor(a_assignable);
	while (!v_lexer.f_newline() && v_lexer.f_token() == t_lexer::c_token__BAR) {
		t_at at = v_lexer.f_at();
		v_lexer.f_next();
		node.reset(new ast::t_binary(at, c_instruction__OR_TT, std::move(node), f_xor(false)));
	}
	return node;
}